

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sid.cc
# Opt level: O2

clock_t __thiscall SID::clock(SID *this)

{
  sampling_method sVar1;
  short *psVar2;
  short sVar3;
  short sVar4;
  int iVar5;
  undefined4 extraout_var;
  int in_ECX;
  uint uVar6;
  int iVar7;
  short *in_RDX;
  int iVar8;
  int iVar9;
  uint uVar10;
  cycle_count *in_RSI;
  ulong uVar11;
  ulong uVar12;
  int in_R8D;
  uint uVar13;
  int iVar14;
  int iVar15;
  bool bVar16;
  
  sVar1 = this->sampling;
  if (sVar1 == SAMPLE_INTERPOLATE) {
    uVar13 = this->sample_offset;
    uVar10 = 0;
    do {
      uVar13 = uVar13 + this->cycles_per_sample;
      iVar14 = (int)uVar13 >> 0x10;
      iVar5 = *in_RSI;
      uVar6 = uVar10;
      if (iVar5 < iVar14) break;
      if (in_ECX <= (int)uVar10) goto LAB_001366be;
      iVar15 = 1;
      if (1 < iVar14) {
        iVar15 = iVar14;
      }
      while (iVar15 + -1 != 0) {
        clock(this);
        iVar15 = iVar15 + -1;
      }
      if (0 < iVar14) {
        iVar15 = (this->extfilt).Vo;
        sVar3 = (short)(iVar15 / 0xb);
        if (iVar15 < -0x5800a) {
          sVar3 = -0x8000;
        }
        if (0x57fff < iVar15) {
          sVar3 = 0x7fff;
        }
        this->sample_prev = sVar3;
        clock(this);
      }
      *in_RSI = *in_RSI - iVar14;
      iVar15 = (this->extfilt).Vo;
      sVar3 = (short)(iVar15 / 0xb);
      if (iVar15 < -0x5800a) {
        sVar3 = -0x8000;
      }
      if (0x57fff < iVar15) {
        sVar3 = 0x7fff;
      }
      uVar13 = uVar13 & 0xffff;
      uVar6 = uVar10 + 1;
      this->sample_offset = uVar13;
      in_RDX[(int)(uVar10 * in_R8D)] =
           (short)(((int)sVar3 - (int)this->sample_prev) * uVar13 >> 0x10) + this->sample_prev;
      this->sample_prev = sVar3;
      uVar10 = uVar6;
    } while (iVar14 <= iVar5);
    for (iVar5 = 0; iVar14 = *in_RSI, iVar5 < iVar14 + -1; iVar5 = iVar5 + 1) {
      clock(this);
    }
    if (iVar5 < iVar14) {
      iVar5 = (this->extfilt).Vo;
      sVar3 = -0x8000;
      if (-0x5800b < iVar5) {
        sVar3 = (short)(iVar5 / 0xb);
      }
      sVar4 = 0x7fff;
      if (iVar5 < 0x58000) {
        sVar4 = sVar3;
      }
      this->sample_prev = sVar4;
      clock(this);
      iVar14 = *in_RSI;
    }
    this->sample_offset = this->sample_offset + iVar14 * -0x10000;
    *in_RSI = 0;
    uVar10 = uVar6;
LAB_001366be:
    return (ulong)uVar10;
  }
  if (sVar1 == SAMPLE_RESAMPLE_INTERPOLATE) {
    uVar13 = this->sample_offset;
    uVar11 = 0;
    do {
      uVar13 = uVar13 + this->cycles_per_sample;
      iVar14 = (int)uVar13 >> 0x10;
      iVar5 = *in_RSI;
      uVar6 = (uint)uVar11;
      uVar10 = uVar6;
      if (iVar5 < iVar14) break;
      if (in_ECX <= (int)uVar6) {
        return uVar11;
      }
      iVar15 = 0;
      if (0 < iVar14) {
        iVar15 = iVar14;
      }
      while (bVar16 = iVar15 != 0, iVar15 = iVar15 + -1, bVar16) {
        clock(this);
        iVar8 = (this->extfilt).Vo;
        sVar3 = (short)(iVar8 / 0xb);
        if (iVar8 < -0x5800a) {
          sVar3 = -0x8000;
        }
        if (0x57fff < iVar8) {
          sVar3 = 0x7fff;
        }
        psVar2 = this->sample;
        iVar8 = this->sample_index;
        psVar2[(long)iVar8 + 0x4000] = sVar3;
        psVar2[iVar8] = sVar3;
        this->sample_index = iVar8 + 1U & 0x3fff;
      }
      *in_RSI = *in_RSI - iVar14;
      uVar13 = uVar13 & 0xffff;
      this->sample_offset = uVar13;
      iVar15 = this->fir_RES;
      iVar8 = (int)(iVar15 * uVar13) >> 0x10;
      uVar10 = this->fir_N;
      uVar12 = 0;
      uVar11 = 0;
      if (0 < (int)uVar10) {
        uVar11 = (ulong)uVar10;
      }
      iVar7 = 0;
      for (; uVar11 != uVar12; uVar12 = uVar12 + 1) {
        iVar7 = iVar7 + (int)this->fir[(long)(int)(iVar8 * uVar10) + uVar12] *
                        (int)this->sample
                             [(long)this->sample_index + ((uVar12 + 0x4000) - (long)(int)uVar10)];
      }
      iVar8 = iVar8 + 1;
      uVar12 = 0;
      bVar16 = iVar8 != iVar15;
      if (!bVar16) {
        iVar8 = 0;
      }
      iVar9 = 0;
      for (; uVar11 != uVar12; uVar12 = uVar12 + 1) {
        iVar9 = iVar9 + (int)this->fir[(long)(int)(iVar8 * uVar10) + uVar12] *
                        (int)this->sample
                             [(long)this->sample_index +
                              (((ulong)bVar16 + uVar12 + 0x3fff) - (long)(int)uVar10)];
      }
      iVar15 = ((int)((iVar9 - iVar7) * (iVar15 * uVar13 & 0xffff)) >> 0x10) + iVar7 >> 0xf;
      if (iVar15 < -0x7fff) {
        iVar15 = -0x8000;
      }
      sVar3 = (short)iVar15;
      if (0x7ffe < iVar15) {
        sVar3 = 0x7fff;
      }
      uVar10 = uVar6 + 1;
      in_RDX[(int)(uVar6 * in_R8D)] = sVar3;
      uVar11 = (ulong)uVar10;
    } while (iVar14 <= iVar5);
    for (iVar5 = 0; iVar5 < *in_RSI; iVar5 = iVar5 + 1) {
      clock(this);
      iVar14 = (this->extfilt).Vo;
      sVar3 = (short)(iVar14 / 0xb);
      if (iVar14 < -0x5800a) {
        sVar3 = -0x8000;
      }
      if (0x57fff < iVar14) {
        sVar3 = 0x7fff;
      }
      psVar2 = this->sample;
      iVar14 = this->sample_index;
      psVar2[(long)iVar14 + 0x4000] = sVar3;
      psVar2[iVar14] = sVar3;
      this->sample_index = iVar14 + 1U & 0x3fff;
    }
    this->sample_offset = this->sample_offset + *in_RSI * -0x10000;
    *in_RSI = 0;
    return (ulong)uVar10;
  }
  if (sVar1 != SAMPLE_RESAMPLE_FAST) {
    iVar5 = clock_fast(this,in_RSI,in_RDX,in_ECX,in_R8D);
    return CONCAT44(extraout_var,iVar5);
  }
  uVar13 = this->sample_offset;
  uVar11 = 0;
  do {
    uVar13 = uVar13 + this->cycles_per_sample;
    iVar14 = (int)uVar13 >> 0x10;
    iVar5 = *in_RSI;
    uVar6 = (uint)uVar11;
    uVar10 = uVar6;
    if (iVar5 < iVar14) break;
    if (in_ECX <= (int)uVar6) {
      return uVar11;
    }
    iVar15 = 0;
    if (0 < iVar14) {
      iVar15 = iVar14;
    }
    while (bVar16 = iVar15 != 0, iVar15 = iVar15 + -1, bVar16) {
      clock(this);
      iVar8 = (this->extfilt).Vo;
      sVar3 = (short)(iVar8 / 0xb);
      if (iVar8 < -0x5800a) {
        sVar3 = -0x8000;
      }
      if (0x57fff < iVar8) {
        sVar3 = 0x7fff;
      }
      psVar2 = this->sample;
      iVar8 = this->sample_index;
      psVar2[(long)iVar8 + 0x4000] = sVar3;
      psVar2[iVar8] = sVar3;
      this->sample_index = iVar8 + 1U & 0x3fff;
    }
    *in_RSI = *in_RSI - iVar14;
    uVar13 = uVar13 & 0xffff;
    this->sample_offset = uVar13;
    uVar10 = this->fir_N;
    uVar11 = 0;
    uVar12 = 0;
    if (0 < (int)uVar10) {
      uVar12 = (ulong)uVar10;
    }
    iVar15 = 0;
    for (; uVar12 != uVar11; uVar11 = uVar11 + 1) {
      iVar15 = iVar15 + (int)this->fir[(long)(int)(((int)(this->fir_RES * uVar13) >> 0x10) * uVar10)
                                       + uVar11] *
                        (int)this->sample
                             [(long)this->sample_index + ((uVar11 + 0x4000) - (long)(int)uVar10)];
    }
    iVar15 = iVar15 >> 0xf;
    if (iVar15 < -0x7fff) {
      iVar15 = -0x8000;
    }
    sVar3 = (short)iVar15;
    if (0x7ffe < iVar15) {
      sVar3 = 0x7fff;
    }
    uVar10 = uVar6 + 1;
    in_RDX[(int)(uVar6 * in_R8D)] = sVar3;
    uVar11 = (ulong)uVar10;
  } while (iVar14 <= iVar5);
  for (iVar5 = 0; iVar5 < *in_RSI; iVar5 = iVar5 + 1) {
    clock(this);
    iVar14 = (this->extfilt).Vo;
    sVar3 = (short)(iVar14 / 0xb);
    if (iVar14 < -0x5800a) {
      sVar3 = -0x8000;
    }
    if (0x57fff < iVar14) {
      sVar3 = 0x7fff;
    }
    psVar2 = this->sample;
    iVar14 = this->sample_index;
    psVar2[(long)iVar14 + 0x4000] = sVar3;
    psVar2[iVar14] = sVar3;
    this->sample_index = iVar14 + 1U & 0x3fff;
  }
  this->sample_offset = this->sample_offset + *in_RSI * -0x10000;
  *in_RSI = 0;
  return (ulong)uVar10;
}

Assistant:

int SID::clock(cycle_count& delta_t, short* buf, int n, int interleave)
{
  switch (sampling) {
  default:
  case SAMPLE_FAST:
    return clock_fast(delta_t, buf, n, interleave);
  case SAMPLE_INTERPOLATE:
    return clock_interpolate(delta_t, buf, n, interleave);
  case SAMPLE_RESAMPLE_INTERPOLATE:
    return clock_resample_interpolate(delta_t, buf, n, interleave);
  case SAMPLE_RESAMPLE_FAST:
    return clock_resample_fast(delta_t, buf, n, interleave);
  }
}